

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O0

double __thiscall libDAI::MaxPlus::run(MaxPlus *this)

{
  value_type vVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  value vVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  ulong uVar9;
  Var *pVVar10;
  size_t sVar11;
  reference pvVar12;
  edge_type *peVar13;
  reference puVar14;
  double *pdVar15;
  reference pvVar16;
  reference this_00;
  reference ppVar17;
  size_type sVar18;
  reference pvVar19;
  clock_t cVar20;
  void *pvVar21;
  long *in_RDI;
  double dVar22;
  Real RVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double delta;
  suseconds_t delta_usec;
  time_t delta_sec;
  valConf *new_vc;
  iterator new_el_it;
  valConf empty_vc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v_empty;
  size_t i_4;
  bool identical;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vcconf;
  bool insert_before_vc;
  double vcval;
  valConf *vc;
  int pos;
  bool insert_element;
  iterator it_1;
  size_t facIndex;
  size_t val;
  long lab;
  const_iterator cit;
  int i_3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> relevant_state_indices;
  VarSet *vs;
  Factor *f;
  double valuesum;
  const_iterator last;
  const_iterator it;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *factor_vec;
  Real d;
  size_t val_i;
  size_t max_val_i;
  Real Z;
  nb_cit I_1;
  Prob ECV;
  size_t i_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> max_indices;
  size_t k;
  size_t t_3;
  size_t t_2;
  size_t t_1;
  size_t jJ;
  nb_cit j;
  nb_cit J;
  size_t I;
  size_t i_1;
  size_t iI_2;
  size_t t;
  size_t e;
  size_t iI_1;
  size_t iI;
  size_t i;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> old_beliefs;
  vector<double,_std::allocator<double>_> residuals;
  vector<unsigned_long,_std::allocator<unsigned_long>_> edge_seq;
  Diffs diffs;
  clock_t tic;
  timeval cur_time;
  timeval start_time;
  FactorGraph *g;
  Diffs *in_stack_fffffffffffff758;
  FactorGraph *in_stack_fffffffffffff760;
  __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  *in_stack_fffffffffffff768;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff770;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff778;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffff780;
  const_iterator in_stack_fffffffffffff788;
  Diffs *in_stack_fffffffffffff790;
  size_type in_stack_fffffffffffff798;
  TProb<double> *in_stack_fffffffffffff7a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff7a8;
  MaxPlus *in_stack_fffffffffffff7b0;
  TProb<double> *in_stack_fffffffffffff7b8;
  TProb<double> *in_stack_fffffffffffff7c0;
  double in_stack_fffffffffffff7d8;
  Diffs *in_stack_fffffffffffff7e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff7f8;
  ostream *in_stack_fffffffffffff800;
  value_type in_stack_fffffffffffffa18;
  MaxPlus *in_stack_fffffffffffffa20;
  _List_const_iterator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_390;
  _List_node_base *local_388;
  _Self local_348;
  _List_node_base *local_340;
  ulong local_338;
  byte local_329;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_328;
  byte local_319;
  double local_318;
  reference local_310;
  _Self local_308;
  int local_300;
  byte local_2f9;
  _Self local_2f8;
  TFactor<double> *local_2f0;
  size_t local_2c8;
  Var *local_2c0;
  value_type local_2b8;
  long local_2b0;
  Var *local_2a8;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_2a0;
  int local_298;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_290;
  VarSet *local_278;
  reference local_270;
  double local_268;
  TFactor<double> *local_260;
  __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  local_258;
  undefined8 local_250;
  MaxPlus *local_248;
  ulong local_240;
  value_type local_238;
  double local_230;
  unsigned_long *local_228;
  unsigned_long *local_220;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_218 [4];
  ulong local_1f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1e8;
  value_type local_1d0;
  ulong local_1c8;
  unsigned_long *local_1c0;
  unsigned_long *local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  unsigned_long *local_1a0;
  unsigned_long *local_198;
  size_type local_190;
  unsigned_long *local_188;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_180;
  unsigned_long *local_178;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_170;
  unsigned_long local_168;
  unsigned_long local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  double *local_140;
  size_type local_138;
  ulong local_130;
  ulong local_128;
  Real local_120;
  ulong local_118;
  ulong local_110;
  ulong local_f0;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> local_e8;
  vector<double,_std::allocator<double>_> local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8 [3];
  clock_t local_68;
  timeval local_60;
  timeval local_50 [2];
  string local_30 [32];
  long *local_10;
  
  local_10 = (long *)(**(code **)(*in_RDI + 0x20))();
  in_RDI[0x37] = -0x10000000000000;
  if (1 < (ulong)in_RDI[0x26]) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Starting ");
    (**(code **)(*in_RDI + 0x48))();
    poVar7 = std::operator<<(poVar7,local_30);
    poVar7 = std::operator<<(poVar7,"...");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_30);
  }
  if (2 < (ulong)in_RDI[0x26]) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  iVar5 = gettimeofday(local_50,(__timezone_ptr_t)0x0);
  if (iVar5 != 0) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = "Error with gettimeofday";
    __cxa_throw(puVar8,&char_const*::typeinfo,0);
  }
  local_68 = toc();
  (**(code **)(*local_10 + 0x28))();
  Diffs::Diffs(in_stack_fffffffffffff790,(long)in_stack_fffffffffffff788._M_node,
               (double)in_stack_fffffffffffff780._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbb0ebf);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0xbb0ecc);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)0xbb0ed9);
  (**(code **)(*local_10 + 0x28))();
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::reserve
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
             in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  for (local_f0 = 0; uVar2 = local_f0, uVar9 = (**(code **)(*local_10 + 0x28))(), uVar2 < uVar9;
      local_f0 = local_f0 + 1) {
    pVVar10 = (Var *)(**(code **)(*local_10 + 0x30))(local_10,local_f0);
    Var::states(pVVar10);
    TProb<double>::TProb
              (in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,(Real)in_stack_fffffffffffff790);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::push_back
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               in_stack_fffffffffffff760,(value_type *)in_stack_fffffffffffff758);
    TProb<double>::~TProb((TProb<double> *)0xbb0fd4);
  }
  vVar6 = UpdateType::operator_cast_to_value((UpdateType *)(in_RDI + 0x23));
  if (vVar6 == SEQMAX) {
    for (local_110 = 0; uVar2 = local_110, sVar11 = FactorGraph::nrEdges((FactorGraph *)0xbb1082),
        uVar2 < sVar11; local_110 = local_110 + 1) {
      calcNewMessage(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    }
    FactorGraph::nrEdges((FactorGraph *)0xbb10dd);
    std::vector<double,_std::allocator<double>_>::reserve
              (&in_stack_fffffffffffff790->super_vector<double,_std::allocator<double>_>,
               (size_type)in_stack_fffffffffffff788._M_node);
    for (local_118 = 0; uVar2 = local_118, sVar11 = FactorGraph::nrEdges((FactorGraph *)0xbb1127),
        uVar2 < sVar11; local_118 = local_118 + 1) {
      std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
                ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
                 (in_RDI + 0x30),local_118);
      std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
                ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
                 (in_RDI + 0x2d),local_118);
      local_120 = dist(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                       (DistType)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff760,
                 (value_type_conflict3 *)in_stack_fffffffffffff758);
    }
  }
  else {
    FactorGraph::nrEdges((FactorGraph *)0xbb1200);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff790,
               (size_type)in_stack_fffffffffffff788._M_node);
    for (local_128 = 0; uVar2 = local_128, sVar11 = FactorGraph::nrEdges((FactorGraph *)0xbb124a),
        uVar2 < sVar11; local_128 = local_128 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff770._M_current,
                 (value_type_conflict2 *)in_stack_fffffffffffff768);
    }
  }
  in_RDI[0x29] = 0;
  do {
    bVar3 = false;
    if ((ulong)in_RDI[0x29] < (ulong)in_RDI[0x25]) {
      dVar22 = Diffs::max(in_stack_fffffffffffff758);
      bVar3 = (double)in_RDI[0x24] < dVar22;
    }
    if (!bVar3) {
      if ((*(byte *)(in_RDI + 0x3d) & 1) != 0) {
        std::ostream::operator<<((void *)in_RDI[0x3e],std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<((void *)in_RDI[0x3f],std::endl<char,std::char_traits<char>>);
      }
      dVar22 = Diffs::max(in_stack_fffffffffffff758);
      if ((double)in_RDI[0x28] < dVar22) {
        dVar22 = Diffs::max(in_stack_fffffffffffff758);
        in_RDI[0x28] = (long)dVar22;
      }
      if (1 < (ulong)in_RDI[0x26]) {
        dVar22 = Diffs::max(in_stack_fffffffffffff758);
        if (dVar22 <= (double)in_RDI[0x24]) {
          poVar7 = std::operator<<((ostream *)&std::cout,"MaxPlus::run:  ");
          poVar7 = std::operator<<(poVar7,"converged in ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_RDI[0x29]);
          poVar7 = std::operator<<(poVar7," passes (");
          in_stack_fffffffffffff770._M_current = (double *)toc();
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             (poVar7,(long)in_stack_fffffffffffff770._M_current - local_68);
          poVar7 = std::operator<<(poVar7," clocks).");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "MaxPlus::run:  WARNING: not converged within ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_RDI[0x25]);
          poVar7 = std::operator<<(poVar7," passes (");
          cVar20 = toc();
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,cVar20 - local_68);
          poVar7 = std::operator<<(poVar7," clocks)...final maxdiff:");
          dVar22 = Diffs::max(in_stack_fffffffffffff758);
          pvVar21 = (void *)std::ostream::operator<<(poVar7,dVar22);
          std::ostream::operator<<(pvVar21,std::endl<char,std::char_traits<char>>);
        }
      }
      dVar22 = (double)in_RDI[0x37];
      std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::~vector
                ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
                 in_stack_fffffffffffff770._M_current);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770._M_current);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff770._M_current);
      Diffs::~Diffs((Diffs *)0xbb33b7);
      return dVar22;
    }
    if (5 < (ulong)in_RDI[0x26]) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Start iteration ");
      pvVar21 = (void *)std::ostream::operator<<(poVar7,in_RDI[0x29]);
      std::ostream::operator<<(pvVar21,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&std::cout,"old messages:");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = libDAI::operator<<((ostream *)in_stack_fffffffffffff790,
                                  (vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                   *)in_stack_fffffffffffff788._M_node);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    vVar6 = UpdateType::operator_cast_to_value((UpdateType *)(in_RDI + 0x23));
    if (vVar6 == SEQMAX) {
      for (local_130 = 0; uVar2 = local_130, sVar11 = FactorGraph::nrEdges((FactorGraph *)0xbb1457),
          uVar2 < sVar11; local_130 = local_130 + 1) {
        local_148 = (double *)
                    std::vector<double,_std::allocator<double>_>::begin
                              (&in_stack_fffffffffffff758->
                                super_vector<double,_std::allocator<double>_>);
        local_150 = (double *)
                    std::vector<double,_std::allocator<double>_>::end
                              (&in_stack_fffffffffffff758->
                                super_vector<double,_std::allocator<double>_>);
        local_140 = (double *)
                    std::
                    max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                              (in_stack_fffffffffffff778,in_stack_fffffffffffff770);
        local_158 = (double *)
                    std::vector<double,_std::allocator<double>_>::begin
                              (&in_stack_fffffffffffff758->
                                super_vector<double,_std::allocator<double>_>);
        local_138 = __gnu_cxx::operator-
                              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffff760,
                               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffff758);
        updateMessage(in_stack_fffffffffffff7b0,(size_t)in_stack_fffffffffffff7a8);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](&local_d0,local_138);
        *pvVar12 = 0.0;
        peVar13 = FactorGraph::edge(in_stack_fffffffffffff760,(size_t)in_stack_fffffffffffff758);
        local_160 = peVar13->first;
        peVar13 = FactorGraph::edge(in_stack_fffffffffffff760,(size_t)in_stack_fffffffffffff758);
        local_168 = peVar13->second;
        FactorGraph::nbV(in_stack_fffffffffffff760,(size_t)in_stack_fffffffffffff758);
        local_170._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffff758);
        while( true ) {
          FactorGraph::nbV(in_stack_fffffffffffff760,(size_t)in_stack_fffffffffffff758);
          local_178 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffff758);
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffff760,
                             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffff758);
          if (!bVar3) break;
          puVar14 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_170);
          if (*puVar14 != local_168) {
            __gnu_cxx::
            __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator*(&local_170);
            FactorGraph::nbF(in_stack_fffffffffffff760,(size_t)in_stack_fffffffffffff758);
            local_180._M_current =
                 (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffff758);
            while( true ) {
              __gnu_cxx::
              __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator*(&local_170);
              FactorGraph::nbF(in_stack_fffffffffffff760,(size_t)in_stack_fffffffffffff758);
              local_188 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_fffffffffffff758);
              bVar3 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_fffffffffffff760,
                                 (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_fffffffffffff758);
              if (!bVar3) break;
              puVar14 = __gnu_cxx::
                        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator*(&local_180);
              if (*puVar14 != local_160) {
                __gnu_cxx::
                __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_180);
                __gnu_cxx::
                __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_170);
                local_190 = FactorGraph::edge(in_stack_fffffffffffff760,
                                              (size_t)in_stack_fffffffffffff758,0xbb176a);
                calcNewMessage(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
                std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::
                operator[]((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *
                           )(in_RDI + 0x30),local_190);
                std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::
                operator[]((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *
                           )(in_RDI + 0x2d),local_190);
                RVar23 = dist(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                              (DistType)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
                pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (&local_d0,local_190);
                *pvVar12 = RVar23;
              }
              local_198 = (unsigned_long *)
                          __gnu_cxx::
                          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                        *)in_stack_fffffffffffff768,
                                       (int)((ulong)in_stack_fffffffffffff760 >> 0x20));
            }
          }
          local_1a0 = (unsigned_long *)
                      __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)in_stack_fffffffffffff768,
                                   (int)((ulong)in_stack_fffffffffffff760 >> 0x20));
        }
      }
    }
    else {
      vVar6 = UpdateType::operator_cast_to_value((UpdateType *)(in_RDI + 0x23));
      if (vVar6 == PARALL) {
        for (local_1a8 = 0; uVar2 = local_1a8,
            sVar11 = FactorGraph::nrEdges((FactorGraph *)0xbb18d1), uVar2 < sVar11;
            local_1a8 = local_1a8 + 1) {
          calcNewMessage(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
        }
        for (local_1b0 = 0; uVar2 = local_1b0,
            sVar11 = FactorGraph::nrEdges((FactorGraph *)0xbb1948), uVar2 < sVar11;
            local_1b0 = local_1b0 + 1) {
          updateMessage(in_stack_fffffffffffff7b0,(size_t)in_stack_fffffffffffff7a8);
        }
      }
      else {
        vVar6 = UpdateType::operator_cast_to_value((UpdateType *)(in_RDI + 0x23));
        if (vVar6 == SEQRND) {
          local_1b8 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffff758);
          local_1c0 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffff758);
          std::
          random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (in_stack_fffffffffffff780,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )in_stack_fffffffffffff778._M_current);
        }
        for (local_1c8 = 0; uVar2 = local_1c8,
            sVar11 = FactorGraph::nrEdges((FactorGraph *)0xbb1a38), uVar2 < sVar11;
            local_1c8 = local_1c8 + 1) {
          pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (local_b8,local_1c8);
          local_1d0 = *pvVar16;
          calcNewMessage(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
          updateMessage(in_stack_fffffffffffff7b0,(size_t)in_stack_fffffffffffff7a8);
        }
      }
    }
    (**(code **)(*local_10 + 0x28))();
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xbb1af4);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff780._M_current,(size_type)in_stack_fffffffffffff778._M_current,
               (allocator_type *)in_stack_fffffffffffff770._M_current);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xbb1b20);
    for (local_1f8 = 0; uVar2 = local_1f8, uVar9 = (**(code **)(*local_10 + 0x28))(), uVar2 < uVar9;
        local_1f8 = local_1f8 + 1) {
      pVVar10 = (Var *)(**(code **)(*local_10 + 0x30))(local_10,local_1f8);
      Var::states(pVVar10);
      TProb<double>::TProb
                (in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,(Real)in_stack_fffffffffffff790
                );
      FactorGraph::nbV(in_stack_fffffffffffff760,(size_t)in_stack_fffffffffffff758);
      local_218[0]._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffff758);
      while( true ) {
        FactorGraph::nbV(in_stack_fffffffffffff760,(size_t)in_stack_fffffffffffff758);
        local_220 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff758);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffff760,
                           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffff758);
        if (!bVar3) break;
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_218);
        message((MaxPlus *)in_stack_fffffffffffff770._M_current,(size_t)in_stack_fffffffffffff768,
                (size_t)in_stack_fffffffffffff760);
        TProb<double>::operator+=
                  ((TProb<double> *)in_stack_fffffffffffff780._M_current,
                   (TProb<double> *)in_stack_fffffffffffff778._M_current);
        local_228 = (unsigned_long *)
                    __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_fffffffffffff768,
                                 (int)((ulong)in_stack_fffffffffffff760 >> 0x20));
      }
      local_230 = -INFINITY;
      local_238 = 0;
      for (local_240 = 0; uVar2 = local_240, sVar11 = TProb<double>::size((TProb<double> *)0xbb1d6a)
          , uVar2 < sVar11; local_240 = local_240 + 1) {
        pdVar15 = TProb<double>::operator[]
                            ((TProb<double> *)in_stack_fffffffffffff760,
                             (size_t)in_stack_fffffffffffff758);
        if (local_230 < *pdVar15) {
          pdVar15 = TProb<double>::operator[]
                              ((TProb<double> *)in_stack_fffffffffffff760,
                               (size_t)in_stack_fffffffffffff758);
          local_230 = *pdVar15;
          local_238 = local_240;
        }
      }
      in_stack_fffffffffffffa18 = local_238;
      pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_1e8,local_1f8);
      *pvVar16 = in_stack_fffffffffffffa18;
      std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
                (&local_e8,local_1f8);
      in_stack_fffffffffffffa20 =
           (MaxPlus *)
           dist(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                (DistType)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
      local_248 = in_stack_fffffffffffffa20;
      Diffs::push(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
      std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
                (&local_e8,local_1f8);
      TProb<double>::operator=
                ((TProb<double> *)in_stack_fffffffffffff760,
                 (TProb<double> *)in_stack_fffffffffffff758);
      TProb<double>::~TProb((TProb<double> *)0xbb1ee5);
    }
    if (2 < (ulong)in_RDI[0x26]) {
      poVar7 = std::operator<<((ostream *)&std::cout,"MaxPlus::run:  maxdiff ");
      dVar22 = Diffs::max(in_stack_fffffffffffff758);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar22);
      poVar7 = std::operator<<(poVar7," after ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_RDI[0x29] + 1);
      poVar7 = std::operator<<(poVar7," passes");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    local_250 = (**(code **)(*local_10 + 0x58))();
    local_258._M_current =
         (TFactor<double> *)
         std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::begin
                   ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                    in_stack_fffffffffffff758);
    local_260 = (TFactor<double> *)
                std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::end
                          ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                            *)in_stack_fffffffffffff758);
    local_268 = 0.0;
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                               *)in_stack_fffffffffffff760,
                              (__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                               *)in_stack_fffffffffffff758), bVar3) {
      local_270 = __gnu_cxx::
                  __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                  ::operator*(&local_258);
      local_278 = TFactor<double>::vars(local_270);
      VarSet::size((VarSet *)0xbb20af);
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xbb20ce);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff780._M_current,
                 (size_type)in_stack_fffffffffffff778._M_current,
                 (allocator_type *)in_stack_fffffffffffff770._M_current);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xbb20fa);
      local_298 = 0;
      local_2a0._M_current = (Var *)VarSet::begin((VarSet *)in_stack_fffffffffffff758);
      while( true ) {
        local_2a8 = (Var *)VarSet::end((VarSet *)in_stack_fffffffffffff758);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                            *)in_stack_fffffffffffff760,
                           (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                            *)in_stack_fffffffffffff758);
        if (!bVar3) break;
        this_00 = __gnu_cxx::
                  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                  ::operator*(&local_2a0);
        local_2b0 = Var::label(this_00);
        pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffff760,(size_type)in_stack_fffffffffffff758);
        vVar1 = *pvVar16;
        local_2b8 = vVar1;
        pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&local_290,(long)local_298);
        *pvVar16 = vVar1;
        local_298 = local_298 + 1;
        local_2c0 = (Var *)__gnu_cxx::
                           __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                           ::operator++((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                                         *)in_stack_fffffffffffff768,
                                        (int)((ulong)in_stack_fffffffffffff760 >> 0x20));
      }
      VarSet::VarSet((VarSet *)in_stack_fffffffffffff760,(VarSet *)in_stack_fffffffffffff758);
      sVar11 = TFactor<double>::IndividualToJointFactorIndex
                         ((VarSet *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
      VarSet::~VarSet((VarSet *)0xbb22b1);
      local_2c8 = sVar11;
      dVar22 = TFactor<double>::operator[]
                         ((TFactor<double> *)in_stack_fffffffffffff760,
                          (size_t)in_stack_fffffffffffff758);
      local_268 = dVar22 + local_268;
      local_2f0 = (TFactor<double> *)
                  __gnu_cxx::
                  __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                  ::operator++(in_stack_fffffffffffff768,
                               (int)((ulong)in_stack_fffffffffffff760 >> 0x20));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff770._M_current);
    }
    if (2 < (ulong)in_RDI[0x26]) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "current estimated maximizing configuration attains: ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_268);
      poVar7 = std::operator<<(poVar7," (the k=");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_RDI[0x38]);
      poVar7 = std::operator<<(poVar7,"-th Value is ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(double)in_RDI[0x3c]);
      poVar7 = std::operator<<(poVar7,")");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    if ((double)in_RDI[0x3c] + 1e-09 < local_268) {
      if (3 < (ulong)in_RDI[0x26]) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "\tchecking to add this configuration to solutions");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      local_2f8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::begin((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)in_stack_fffffffffffff758);
      local_2f9 = 1;
      local_300 = 0;
      while( true ) {
        local_308._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::end((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)in_stack_fffffffffffff758);
        bVar3 = std::operator!=(&local_2f8,&local_308);
        if (!bVar3) break;
        local_310 = std::
                    _List_iterator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ::operator*((_List_iterator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)0xbb2552);
        local_318 = local_310->first;
        if (4 < (ulong)in_RDI[0x26]) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "\tchecking to see if it should be inserted before the entry at position "
                                  );
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_300);
          poVar7 = std::operator<<(poVar7," (with value ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_318);
          poVar7 = std::operator<<(poVar7,")...");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        local_319 = 0;
        if ((local_268 + 1e-09 < local_318) && (local_319 = 1, 4 < (ulong)in_RDI[0x26])) {
          poVar7 = std::operator<<((ostream *)&std::cout,"\tYes!  valuesum(");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_268);
          poVar7 = std::operator<<(poVar7,") + V_EPS(");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,1e-09);
          poVar7 = std::operator<<(poVar7,") < vcval(");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_318);
          poVar7 = std::operator<<(poVar7," )");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        bVar3 = MADP_util::EqualValue(local_318,local_268);
        if (bVar3) {
          local_319 = 1;
          if (4 < (ulong)in_RDI[0x26]) {
            poVar7 = std::operator<<((ostream *)&std::cout,"\tYes!  valuesum(");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_268);
            poVar7 = std::operator<<(poVar7,") + V_EPS(");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,1e-09);
            poVar7 = std::operator<<(poVar7,") == vcval(");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_318);
            poVar7 = std::operator<<(poVar7," )");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          local_328 = &local_310->second;
          local_329 = 1;
          for (local_338 = 0; uVar2 = local_338,
              sVar18 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_328),
              uVar2 < sVar18; local_338 = local_338 + 1) {
            pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffff760,(size_type)in_stack_fffffffffffff758);
            vVar1 = *pvVar16;
            pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (local_328,local_338);
            if (vVar1 != *pvVar16) {
              local_329 = 0;
              break;
            }
          }
          if ((local_329 & 1) != 0) {
            if (3 < (ulong)in_RDI[0x26]) {
              poVar7 = std::operator<<((ostream *)&std::cout,
                                       "\tnewly found conf identical to one already stored...");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
            local_2f9 = 0;
          }
        }
        if ((local_319 & 1) != 0) break;
        local_340 = (_List_node_base *)
                    std::
                    _List_iterator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ::operator++(&local_2f8,0);
        local_300 = local_300 + 1;
      }
      local_348._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::begin((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)in_stack_fffffffffffff758);
      bVar4 = std::operator==(&local_2f8,&local_348);
      bVar3 = false;
      if (bVar4) {
        sVar18 = std::__cxx11::
                 list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ::size((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                         *)in_stack_fffffffffffff760);
        bVar3 = sVar18 == in_RDI[0x38];
      }
      if (bVar3) {
        if (3 < (ulong)in_RDI[0x26]) {
          poVar7 = std::operator<<((ostream *)&std::cout,"\tDon\'t bother value (");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_268);
          poVar7 = std::operator<<(poVar7,") not high enough...");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        local_2f9 = 0;
      }
      if ((local_2f9 & 1) == 0) {
        if (3 < (ulong)in_RDI[0x26]) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "\t*NOT* inserting the newly found configuration");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbb2b42);
        std::make_pair<double&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                  ((double *)in_stack_fffffffffffff768,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff760);
        std::
        _List_const_iterator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::_List_const_iterator(&local_390,&local_2f8);
        local_388 = (_List_node_base *)
                    std::__cxx11::
                    list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::insert((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              *)in_stack_fffffffffffff780._M_current,in_stack_fffffffffffff788,
                             (value_type *)in_stack_fffffffffffff778._M_current);
        ppVar17 = std::
                  _List_iterator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::operator*((_List_iterator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)0xbb2bd0);
        if (3 < (ulong)in_RDI[0x26]) {
          poVar7 = std::operator<<((ostream *)&std::cout,"\tvalue of inserted valconf = ");
          pvVar21 = (void *)std::ostream::operator<<(poVar7,ppVar17->first);
          std::ostream::operator<<(pvVar21,std::endl<char,std::char_traits<char>>);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
        sVar18 = std::__cxx11::
                 list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ::size((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                         *)in_stack_fffffffffffff760);
        if ((ulong)in_RDI[0x38] < sVar18) {
          std::__cxx11::
          list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::pop_front((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                       *)in_stack_fffffffffffff760);
        }
        sVar18 = std::__cxx11::
                 list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ::size((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                         *)in_stack_fffffffffffff760);
        if (sVar18 == in_RDI[0x38]) {
          pvVar19 = std::__cxx11::
                    list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::front((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                             *)in_stack_fffffffffffff760);
          in_RDI[0x3c] = (long)pvVar19->first;
        }
        std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~pair
                  ((pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                   0xbb2d39);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff770._M_current);
      }
    }
    if ((double)in_RDI[0x37] < local_268) {
      uVar24 = 0;
      in_RDI[0x37] = (long)local_268;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff800,
                 in_stack_fffffffffffff7f8);
      iVar5 = gettimeofday(&local_60,(__timezone_ptr_t)0x0);
      if (iVar5 != 0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = "Error with gettimeofday";
        __cxa_throw(puVar8,&char_const*::typeinfo,0);
      }
      auVar25._0_8_ = (double)(local_60.tv_sec - local_50[0].tv_sec);
      auVar25._8_8_ = uVar24;
      auVar26._0_8_ = (double)(local_60.tv_usec - local_50[0].tv_usec);
      auVar26._8_8_ = uVar24;
      auVar25 = vfmadd213sd_fma(ZEXT816(0x412e848000000000),auVar25,auVar26);
      if ((*(byte *)(in_RDI + 0x3d) & 1) != 0) {
        poVar7 = (ostream *)std::ostream::operator<<((void *)in_RDI[0x3e],(double)in_RDI[0x37]);
        std::operator<<(poVar7,"\t");
        poVar7 = (ostream *)std::ostream::operator<<((void *)in_RDI[0x3f],auVar25._0_8_);
        std::operator<<(poVar7,"\t");
      }
      if (1 < (ulong)in_RDI[0x26]) {
        poVar7 = std::operator<<((ostream *)&std::cout,"new best configuration found, value = ");
        pvVar21 = (void *)std::ostream::operator<<(poVar7,(double)in_RDI[0x37]);
        std::ostream::operator<<(pvVar21,std::endl<char,std::char_traits<char>>);
      }
    }
    if (5 < (ulong)in_RDI[0x26]) {
      poVar7 = std::operator<<((ostream *)&std::cout,"new messages:");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = libDAI::operator<<((ostream *)in_stack_fffffffffffff790,
                                  (vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                   *)in_stack_fffffffffffff788._M_node);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      in_stack_fffffffffffff800 = std::operator<<((ostream *)&std::cout,"ending iteration ");
      in_stack_fffffffffffff7f8 =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           std::ostream::operator<<(in_stack_fffffffffffff800,in_RDI[0x29]);
      pvVar21 = (void *)std::ostream::operator<<
                                  (in_stack_fffffffffffff7f8,std::endl<char,std::char_traits<char>>)
      ;
      std::ostream::operator<<(pvVar21,std::endl<char,std::char_traits<char>>);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff770._M_current);
    in_RDI[0x29] = in_RDI[0x29] + 1;
  } while( true );
}

Assistant:

double MaxPlus::run() {
        const FactorGraph& g = grm();
        bestValue = -INFINITY;
        if( Props.verbose >= 2 )
            cout << "Starting " << identify() << "..."<<endl;
        if( Props.verbose >= 3)
           cout << endl; 

        struct timeval start_time, cur_time;
        if(gettimeofday(&start_time, NULL) != 0)
            throw "Error with gettimeofday";

        clock_t tic = toc();
        Diffs diffs(g.nrVars(), 1.0);
        
        vector<size_t> edge_seq; //what does this contain? an ordering (sequence) of edge(indice)s ?
        vector<double> residuals;


        //vector<Factor> old_beliefs;
        vector<Prob> old_beliefs;
        old_beliefs.reserve( g.nrVars() );
        for( size_t i = 0; i < g.nrVars(); i++ )
            //old_beliefs.push_back(beliefV(i));
            //FRANS: we don't want a belief in here but simple a vector with all 0's
            //old_beliefs.push_back(  Factor( g.var(i), 0.0 )  );
            old_beliefs.push_back(  Prob( g.var(i).states(), 0.0 )  );

        if( Props.updates == UpdateType::SEQMAX ) {
            // do the first pass
            for(size_t iI = 0; iI < g.nrEdges(); iI++ ) 
                calcNewMessage(iI);

            // calculate initial residuals
            residuals.reserve(g.nrEdges());
            for( size_t iI = 0; iI < g.nrEdges(); iI++ )
                residuals.push_back( dist( _newmessages[iI], _messages[iI], Prob::DISTLINF ) );
        } else {
            edge_seq.reserve( g.nrEdges() );
            for( size_t e = 0; e < g.nrEdges(); e++ )
                edge_seq.push_back( e );
        }

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props.maxiter && diffs.max() > Props.tol; _iterations++ ) 
        {
            if( Props.verbose >= 6)
            {
               cout << "Start iteration "<<_iterations<<endl ; 
               cout << "old messages:"<< endl << _messages << endl;
            }

            // ---------First update the messages------------
            if( Props.updates == UpdateType::SEQMAX ) {
                // Residuals-MaxPlus by Koller et al.
                for( size_t t = 0; t < g.nrEdges(); t++ ) {
                    // update the message with the largest residual
                    size_t iI = max_element(residuals.begin(), residuals.end()) - residuals.begin();
                    updateMessage( iI );
                    residuals[iI] = 0;

                    // I->i has been updated, which means that residuals for all
                    // J->j with J in nb[i]\I and j in nb[J]\i have to be updated
                    size_t i = g.edge(iI).first;
                    size_t I = g.edge(iI).second;
                    for( FactorGraph::nb_cit J = g.nbV(i).begin(); J != g.nbV(i).end(); J++ ) 
                        if( *J != I )
                            for( FactorGraph::nb_cit j = g.nbF(*J).begin(); j != g.nbF(*J).end(); j++ )
                                if( *j != i ) {
                                    size_t jJ = g.edge(*j,*J);
                                    calcNewMessage(jJ);
                                    residuals[jJ] = dist( _newmessages[jJ], _messages[jJ], Prob::DISTLINF );
                                }
                }
            } else if( Props.updates == UpdateType::PARALL ) {
                // Parallel updates 
                for( size_t t = 0; t < g.nrEdges(); t++ )
                    calcNewMessage(t);

                for( size_t t = 0; t < g.nrEdges(); t++ )
                    updateMessage( t );
            } else {
                // Sequential updates
                if( Props.updates == UpdateType::SEQRND )
                    random_shuffle( edge_seq.begin(), edge_seq.end() );
                
                for( size_t t = 0; t < g.nrEdges(); t++ ) {
                    size_t k = edge_seq[t]; //FRANS: k is what?
                    calcNewMessage( k );
                    updateMessage( k );
                }
            }
            
            // ---------End updating the messages------------


            // compute, for each variable, the value that maximizes the sum of the factors it 
            // participates in.
            // I.e., if v0 is var with 3 values ('states') a,b,c and participates in F0 and F1, 
            // and it received the following messages
            //      Mess F0 -> v0 = [0 6 0 ]
            //      Mess F1 -> v0 = [3 0 0 ]
            // then it should take value b, corresponding to the maximizing index in
            // the vector [3 6 0], which we call the 
            //  `estimated contribution vector' ECV

            //max_indices stores the indices of the maximizing values ('states') for each variable
            vector<size_t> max_indices( g.nrVars() );
            for( size_t i = 0; i < g.nrVars(); i++ )
            {
                /* need not use Factor class here...
                Factor ECV( g.var( i ), 0.0);
                Var i_th_var = g.var(i);
                VarSet temp_vs (i_th_var);
                //loop over factors I that are neighbors of var i
                for( FactorGraph::nb_cit I = g.nbV(i).begin(); I != g.nbV(i).end(); I++ )
                    ECV += Factor( temp_vs, message(i,*I) );
                */
                Prob ECV( g.var(i).states() , 0.0);
                //loop over factors I that are neighbors of var i
                for( FactorGraph::nb_cit I = g.nbV(i).begin(); I != g.nbV(i).end(); I++ )
                    ECV += message(i,*I);

                //find the maximum index (i.e., the value the variable should take according to ECV)
                Real Z = -INFINITY;
                size_t max_val_i = 0;
                for( size_t val_i = 0; val_i < ECV.size(); val_i++ ) {
                    if( ECV[val_i] > Z )
                    {
                        Z = ECV[val_i];
                        max_val_i = val_i;
                    }
                }
                max_indices[i] = max_val_i;
#if 0                
                if( Props.verbose >= 3)
                {
                    cout << "ECV for var "<<i<<" = "<< ECV ;
                    if( Props.verbose >= 4)
                        cout << "->best value of var "<<i<<" is " << max_val_i << " (with expected sum "<<Z<<")";
                    cout << endl;
                }
#endif                 

                //compute distance to last ECV
                Real d =  dist( ECV, old_beliefs[i], Prob::DISTLINF );
                diffs.push( d );
#if 0                
                if( Props.verbose >= 4 ) {
                    if( Props.verbose >= 6 )
                        cout << "\t\t\told_beliefs[i]"<< old_beliefs[i] <<endl << "\t\t\tdist d="<<d<<endl;
                    cout << "\t\tdiffs = "<<diffs<<endl;
                }
#endif                 
                old_beliefs[i] = ECV;
            }
            if( Props.verbose >= 3 )
                cout << "MaxPlus::run:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;

            //compute the value of the currently chosen config
            //
            const std::vector<Factor> & factor_vec = g.factors();
            std::vector<Factor>::const_iterator it = factor_vec.begin();
            std::vector<Factor>::const_iterator last = factor_vec.end();

            double valuesum = 0.0;
            while(it != last) //loop over all factors to compute value
            {
                const Factor & f = *it;
                const VarSet & vs = f.vars();

                //we need to compute the index into f.p() that corresponds to 
                //the (state) configuration as defined by max_indices.
                //
                //suppose the state configuration is <2 1 3 5>, 
                //when f includes vars 1 2 and 4, the relevant configuration is <2 1 5>
                //suppose that the number of states of these relevant vars is <3 4 6>,
                //then the index should be computed as
                //2 + 1 * (3) + 5 * (3*4) = 2 + 3 + 60 = 65
                //
                //(remember the index with the lowest index is the least significant in libDAI)

                //first we construct the vector of 'relevant' indices (those for vs)
                vector<size_t> relevant_state_indices(vs.size());                
                int i=0;
                for(VarSet::const_iterator cit = vs.begin(); cit != vs.end(); cit++)
                { 
                    //the index ('label') of the next of the variable of vs:
                    long lab =  (*cit).label();                    
                    // the (index of the) value(state) that variable
                    //takes in the (estimated) maximizing configuration:
                    //!!! if it crashes here: is the FG connected 'enough' ?! (because it will give problems of not!)
                    //(i.e., if not all variables are included in a factor, things mess up here...)
                    size_t val = max_indices.at(lab);
                    //relevant_state_indices.push_back( val );
                    relevant_state_indices[i] = val;
                    i++;
                }
                //now compute the 'joint factor' index
                size_t facIndex = Factor::IndividualToJointFactorIndex(vs, relevant_state_indices);
                valuesum += f[facIndex];
                it++;
            }
            if( Props.verbose >= 3)
                cout << "current estimated maximizing configuration attains: " << 
                    valuesum << 
                    " (the k=" <<_k<< "-th Value is " << _k_th_Val << ")" << endl;

            if(valuesum > _k_th_Val + V_EPS)
            {
                if( Props.verbose >= 4)
                    cout << "\tchecking to add this configuration to solutions"<<endl;
                list< MADP_util::valConf >::iterator it = _valConfs.begin();
                //boolean that indicates whether we should store max_indices
                bool insert_element = true;
                int pos = 0;
                while(it != _valConfs.end() )
                {
                    valConf& vc = *it;
                    double vcval = vc.first;
                    
                    if( Props.verbose >= 5)
                        cout << "\tchecking to see if it should be inserted before the entry at position "<< pos << " (with value "<<vcval<<")..."<<endl;

                    //boolean that will indicate whether the new found policy needs
                    //to be inserted before vc
                    bool insert_before_vc = false;
                    if( valuesum + V_EPS < vcval)
                    {
                        insert_before_vc = true;
                        if( Props.verbose >= 5)
                            cout << "\tYes!  valuesum("<<valuesum<<") + V_EPS("<<
                                V_EPS<<") < vcval("<<vcval<<" )"<<endl;
                    }
                        
                    if( EqualValue(vcval, valuesum) )
                    {
                        //insert before vc 
                        insert_before_vc = true;
                        if( Props.verbose >= 5)
                            cout << "\tYes!  valuesum("<<valuesum<<") + V_EPS("<<
                                V_EPS<<") == vcval("<<vcval<<" )"<<endl;

                        //but make sure the condigurations are different!
                        vector<size_t>& vcconf=vc.second;
                        bool identical = true;
                        for( size_t i=0; i < vcconf.size(); i++)
                        {
                            if(max_indices.at(i) != vcconf[i] )
                            {
                                identical = false;
                                break;
                            }
                        }
                        if(identical)
                        {
                            if( Props.verbose >= 4)
                                cout <<"\tnewly found conf identical to one already stored..."<<endl;
                            insert_element = false;
                        }
                    }

                    if(insert_before_vc)
                        break;

                    it++;
                    pos++;
                }
                //it now points to the element before which max_indices should be
                //inserted
                if(it == _valConfs.begin() && _valConfs.size() == _k )
                {
                    if( Props.verbose >= 4)
                        cout <<"\tDon't bother value ("<< valuesum <<
                            ") not high enough..."<< endl;
                    //don't bother, since the new one become the k+1-th element
                    insert_element = false;
                }
                if(insert_element)
                {
                    //to avoid uneceesary copying, we insert an 'empty' valconf
                    vector<size_t> v_empty;
                    valConf empty_vc = make_pair(valuesum, v_empty );
                    list< valConf >::iterator new_el_it = _valConfs.insert(it, empty_vc);
                    valConf& new_vc = (*new_el_it);
                    if( Props.verbose >= 4)
                        cout <<"\tvalue of inserted valconf = "<< new_vc.first<<endl;
                    new_vc.second = max_indices;
                    //check to see if we need to delete the last element
                    if(_valConfs.size() > _k)
                        _valConfs.pop_front();
                    if(_valConfs.size() == _k)
                        _k_th_Val = _valConfs.front().first;
                }
                else
                    if( Props.verbose >= 4)
                        cout <<"\t*NOT* inserting the newly found configuration"<< endl;

            }
            if(valuesum > bestValue)
            {
                bestValue = valuesum;
                bestConfiguration = max_indices;
                if(gettimeofday(&cur_time, NULL) != 0)
                    throw "Error with gettimeofday";

                time_t delta_sec = cur_time.tv_sec - start_time.tv_sec;
                suseconds_t delta_usec = cur_time.tv_usec - start_time.tv_usec;
                double delta = 1000000.0 * delta_sec + delta_usec; //in microsecond

                if(writeAnyTimeResults){
                    (*results_f) << bestValue << "\t";
                    (*timings_f) << delta << "\t";
                } 

                if( Props.verbose >= 2)
                    cout << "new best configuration found, value = "<< bestValue << endl;
            }
            if( Props.verbose >= 6)
            {
                cout << "new messages:"<< endl << _messages << endl;
                cout << "ending iteration "<<_iterations<<endl<<endl ; 
            }
        } // <- end of iteration

        //end the line in the results file
        if(writeAnyTimeResults){
            (*results_f) << endl;
            (*timings_f) << endl;
        } 
        
        if( diffs.max() > _maxdiff ) //store the max difference for later inspection.
            _maxdiff = diffs.max();
        if( Props.verbose >= 2 )
        {
            if( diffs.max() > Props.tol ) 
                cout << "MaxPlus::run:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            else  
                cout << "MaxPlus::run:  " << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
        }
        
        //return diffs.max();
        return bestValue;
    }